

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream * QtPrivate::readArrayBasedContainer<QList<QRectF>>(QDataStream *s,QList<QRectF> *c)

{
  QDataStream QVar1;
  char cVar2;
  undefined1 *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  QRectF local_68;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar2 = QDataStream::isDeviceTransactionStarted();
  if (cVar2 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QRectF>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (undefined1 *)(ulong)local_3c;
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_68.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_68);
    asize = (undefined1 *)local_68.xp;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QRectF>::reserve(c,(qsizetype)asize);
    while (asize != (undefined1 *)0x0) {
      asize = asize + -1;
      local_68.xp = 0.0;
      local_68.yp = 0.0;
      local_68.w = 0.0;
      local_68.h = 0.0;
      ::operator>>(s,&local_68);
      if (s[0x13] != (QDataStream)0x0) {
        QList<QRectF>::clear(c);
        break;
      }
      QMovableArrayOps<QRectF>::emplace<QRectF_const&>
                ((QMovableArrayOps<QRectF> *)c,(c->d).size,&local_68);
      QList<QRectF>::end(c);
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}